

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

bool __thiscall
xscript::parser::ast::parse_expression
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent,int precedence)

{
  uint uVar1;
  token_t_conflict tVar2;
  token_t t;
  bool bVar3;
  int precedence_00;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *parent_00;
  ast *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  undefined1 local_88 [64];
  basic_string_view<char,_std::char_traits<char>_> local_48;
  int local_38;
  allocator<char> local_31;
  
  tVar2 = (this->cur_token).type;
  uVar1 = tVar2 - TK_SUB;
  local_38 = precedence;
  if (((0x39 < uVar1) || ((0x200000003800041U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
     (tVar2 != TK_CO)) {
    this_00 = this;
    bVar3 = parse_basic_expression(this,parent);
    goto LAB_0011d85f;
  }
  parent_00 = ast_node::add_child((parent->_M_t).
                                  super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                                  .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>.
                                  _M_head_impl,UNARY_EXPRESSION);
  parse_token(this,parent_00);
  precedence_00 = 2;
LAB_0011d9ae:
  this_00 = this;
  bVar3 = parse_expression(this,parent_00,precedence_00);
LAB_0011d85f:
  if (bVar3 == false) {
    return false;
  }
  do {
    while( true ) {
      t = (this->cur_token).type;
      precedence_00 = operator_precedence(this_00,t);
      if (precedence_00 < 0) {
        return true;
      }
      if (t - TK_ASSIGN < 0xd) {
        if (local_38 < precedence_00) {
          return true;
        }
      }
      else if (local_38 <= precedence_00) {
        return true;
      }
      parent_00 = ast_node::replace_child
                            ((parent->_M_t).
                             super___uniq_ptr_impl<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_xscript::parser::ast_node_*,_std::default_delete<xscript::parser::ast_node>_>
                             .super__Head_base<0UL,_xscript::parser::ast_node_*,_false>._M_head_impl
                             ,BINARY_EXPRESSION);
      parse_token(this,parent_00);
      if (t != TK_LEFT_BRACK) break;
      if ((this->cur_token).type != TK_RIGHT_BRACK) {
        bVar3 = parse_expression(this,parent_00);
        if (!bVar3) {
          return false;
        }
        if ((this->cur_token).type != TK_RIGHT_BRACK) {
          this_00 = (ast *)(local_88 + 0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)this_00,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                     &local_31);
          local_48._M_len = 0xc;
          local_48._M_str = "\']\' expected";
          args_00._M_len = 1;
          args_00._M_array = &local_48;
          append_syntax_error(this,(string *)this_00,0x251,args_00);
          goto LAB_0011d99e;
        }
      }
LAB_0011d94f:
      this_00 = this;
      next(this);
    }
    if (t != TK_LEFT_PAREN) goto LAB_0011d9ae;
    bVar3 = parse_function_call_parameter(this,parent_00);
    if (!bVar3) {
      return false;
    }
    if ((this->cur_token).type == TK_RIGHT_PAREN) goto LAB_0011d94f;
    this_00 = (ast *)local_88;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this_00,"build_O2/src/CMakeFiles/xscript.dir/compiler_depend.ts",&local_31)
    ;
    local_48._M_len = 0xc;
    local_48._M_str = "\')\' expected";
    args._M_len = 1;
    args._M_array = &local_48;
    append_syntax_error(this,(string *)this_00,0x245,args);
LAB_0011d99e:
    std::__cxx11::string::~string((string *)this_00);
  } while( true );
}

Assistant:

bool ast::parse_expression(std::unique_ptr<ast_node>& parent, int precedence) {
    switch (cur_token.type) {
        case tokenizer::TK_LOGIC_NOT: // 逻辑非运算符
        case tokenizer::TK_BITWISE_NOT: // 按位取反运算符
        case tokenizer::TK_SUB: // 负号运算符
        case tokenizer::TK_INC: // 自增运算符
        case tokenizer::TK_DEC: // 自减运算符
        case tokenizer::TK_CO:  // 协程运算符
        case tokenizer::TK_TYPEOF: // 类型运算符
        {
            std::unique_ptr<ast_node>& unary_expression = parent->add_child(UNARY_EXPRESSION);
            if (!parse_token(unary_expression)) {
                return false;
            } 
            if (!parse_expression(unary_expression, 2)) {
                return false;
            }
            break;
        }
        default:
            if (!parse_basic_expression(parent)) {
                return false;
            }
    }

    int p = operator_precedence(cur_token.type);
    while (true) {
        if (p < 0) {
            return true;
        } else {
            switch (cur_token.type) {
                case tokenizer::TK_LOGIC_AND:
                case tokenizer::TK_LOGIC_OR:
                case tokenizer::TK_ASSIGN:
                case tokenizer::TK_ASSIGN_ADD:
                case tokenizer::TK_ASSIGN_SUB:
                case tokenizer::TK_ASSIGN_MUL:
                case tokenizer::TK_ASSIGN_DIV:
                case tokenizer::TK_ASSIGN_MOD:
                case tokenizer::TK_ASSIGN_AND:
                case tokenizer::TK_ASSIGN_OR:
                case tokenizer::TK_ASSIGN_XOR:
                case tokenizer::TK_ASSIGN_SHL:
                case tokenizer::TK_ASSIGN_SHR:
                    // 右结合操作符
                    if (p > precedence) {
                        return true;
                    }
                    break;
                default:
                    // 左结合操作符
                    if (p >= precedence) {
                        return true;
                    }
            }
        }

        tokenizer::token_t t = cur_token.type;

        std::unique_ptr<ast_node>& binary_expression = parent->replace_child(BINARY_EXPRESSION);
        if (!parse_token(binary_expression)) {
            return false;
        }

        if (t == tokenizer::TK_LEFT_PAREN) {
            if (!parse_function_call_parameter(binary_expression)) {
                return false;
            }

            if (cur_token != tokenizer::TK_RIGHT_PAREN) {
                syntax_error({"')' expected"});
            } else {
                next();
            }
        } else if (t == tokenizer::TK_LEFT_BRACK) {
            if (cur_token != tokenizer::TK_RIGHT_BRACK) {
                if (!parse_expression(binary_expression)) {
                    return false;
                }
            }

            if (cur_token != tokenizer::TK_RIGHT_BRACK) {
                syntax_error({"']' expected"});
            } else {
                next();
            }
        } else {
            if (!parse_expression(binary_expression, p)) {
                return false;
            }
        }

        p = operator_precedence(cur_token.type);
    }
}